

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwSetWindowSize(GLFWwindow *handle,int width,int height)

{
  _GLFWwindow *window;
  
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/src/window.c"
                  ,0x20e,"void glfwSetWindowSize(GLFWwindow *, int, int)");
  }
  if (_glfw.initialized != 0) {
    *(int *)(handle + 0x28) = width;
    *(int *)(handle + 0x2c) = height;
    _glfwPlatformSetWindowSize((_GLFWwindow *)handle,width,height);
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwSetWindowSize(GLFWwindow* handle, int width, int height)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    window->videoMode.width  = width;
    window->videoMode.height = height;

    _glfwPlatformSetWindowSize(window, width, height);
}